

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathVariableLookupNS(xmlXPathContextPtr ctxt,xmlChar *name,xmlChar *ns_uri)

{
  xmlXPathObjectPtr val;
  xmlXPathObjectPtr ret;
  xmlChar *ns_uri_local;
  xmlChar *name_local;
  xmlXPathContextPtr ctxt_local;
  
  if (ctxt == (xmlXPathContextPtr)0x0) {
    ctxt_local = (xmlXPathContextPtr)0x0;
  }
  else if ((ctxt->varLookupFunc == (xmlXPathVariableLookupFunc)0x0) ||
          (ctxt_local = (xmlXPathContextPtr)(*ctxt->varLookupFunc)(ctxt->varLookupData,name,ns_uri),
          ctxt_local == (xmlXPathContextPtr)0x0)) {
    if (ctxt->varHash == (xmlHashTablePtr)0x0) {
      ctxt_local = (xmlXPathContextPtr)0x0;
    }
    else if (name == (xmlChar *)0x0) {
      ctxt_local = (xmlXPathContextPtr)0x0;
    }
    else {
      val = (xmlXPathObjectPtr)xmlHashLookup2(ctxt->varHash,name,ns_uri);
      ctxt_local = (xmlXPathContextPtr)xmlXPathCacheObjectCopy(ctxt,val);
    }
  }
  return (xmlXPathObjectPtr)ctxt_local;
}

Assistant:

xmlXPathObjectPtr
xmlXPathVariableLookupNS(xmlXPathContextPtr ctxt, const xmlChar *name,
			 const xmlChar *ns_uri) {
    if (ctxt == NULL)
	return(NULL);

    if (ctxt->varLookupFunc != NULL) {
	xmlXPathObjectPtr ret;

	ret = ((xmlXPathVariableLookupFunc)ctxt->varLookupFunc)
	        (ctxt->varLookupData, name, ns_uri);
	if (ret != NULL) return(ret);
    }

    if (ctxt->varHash == NULL)
	return(NULL);
    if (name == NULL)
	return(NULL);

    return(xmlXPathCacheObjectCopy(ctxt, (xmlXPathObjectPtr)
		xmlHashLookup2(ctxt->varHash, name, ns_uri)));
}